

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

LY_ERR lysp_resolve_ext_instance_records(lysp_ctx *pctx)

{
  lyd_node *plVar1;
  undefined8 *puVar2;
  char *pcVar3;
  lysc_node *__s;
  bool bVar4;
  LY_ERR LVar5;
  int iVar6;
  int iVar7;
  lysp_ext_instance *plVar8;
  lyplg_ext_record *plVar9;
  size_t sVar10;
  void *pvVar11;
  long lVar12;
  lyd_node *plVar13;
  ly_ctx *plVar14;
  lysp_ext_instance *plVar15;
  char *pcVar16;
  lysp_ext_instance *plVar17;
  void *pvVar18;
  lysp_ext_instance *plVar19;
  lyd_meta *plVar20;
  byte bVar21;
  lys_module *mod;
  lysf_ctx fctx;
  char *local_90;
  uint local_84;
  lysp_ext_instance *local_80;
  ulong local_78;
  char *local_70;
  void *local_68;
  lys_module *local_60;
  lysf_ctx local_58;
  
  bVar21 = 0;
  local_58.ext_set.size = 0;
  local_58.ext_set.count = 0;
  local_58.ext_set.field_2.dnodes = (lyd_node **)0x0;
  local_58.mod = (lys_module *)0x0;
  if (pctx == (lysp_ctx *)0x0) {
    local_58.ctx = (ly_ctx *)0x0;
  }
  else {
    local_58.ctx = (ly_ctx *)
                   **(undefined8 **)
                     (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
  }
  if ((pctx->ext_inst).count != 0) {
    local_80 = (lysp_ext_instance *)0x0;
    do {
      plVar19 = (lysp_ext_instance *)(pctx->ext_inst).field_2.dnodes[(long)local_80];
      plVar17 = (lysp_ext_instance *)0x0;
      plVar15 = plVar19;
      while( true ) {
        if (plVar19 == (lysp_ext_instance *)0x0) {
          plVar8 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar8 = plVar19[-1].exts;
        }
        if (plVar8 <= plVar17) break;
        if (pctx == (lysp_ctx *)0x0) {
          plVar14 = (ly_ctx *)0x0;
        }
        else {
          plVar14 = (ly_ctx *)
                    **(undefined8 **)
                      (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
        }
        LVar5 = lysp_ext_find_definition(plVar14,plVar15,&local_60,&plVar15->def);
        if (LVar5 != LY_SUCCESS) {
          return LVar5;
        }
        if (pctx == (lysp_ctx *)0x0) {
          plVar14 = (ly_ctx *)0x0;
        }
        else {
          plVar14 = (ly_ctx *)
                    **(undefined8 **)
                      (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
        }
        LVar5 = lysp_ext_instance_resolve_argument(plVar14,plVar15);
        if (LVar5 != LY_SUCCESS) {
          return LVar5;
        }
        plVar9 = lyplg_ext_record_find
                           (local_60->ctx,local_60->name,local_60->revision,plVar15->def->name);
        plVar15->record = plVar9;
        plVar17 = (lysp_ext_instance *)((long)&plVar17->name + 1);
        plVar15 = plVar15 + 1;
      }
      local_80 = (lysp_ext_instance *)((long)local_80 + 1);
    } while (local_80 < (ulong)(pctx->ext_inst).count);
  }
  if ((pctx->ext_inst).count == 0) {
    return LY_SUCCESS;
  }
  local_78 = 0;
  local_70 = (char *)0x0;
  do {
    plVar1 = (pctx->ext_inst).field_2.dnodes[local_78];
    pvVar18 = (void *)0x0;
LAB_0015cbed:
    plVar19 = (lysp_ext_instance *)(plVar1 + (long)pvVar18 * 2);
    local_80 = plVar19;
    local_68 = pvVar18;
    while( true ) {
      if (plVar1 == (lyd_node *)0x0) {
        pvVar11 = (void *)0x0;
      }
      else {
        pvVar11 = plVar1[-1].priv;
      }
      if (pvVar11 <= pvVar18) break;
      if ((plVar19->record == (lyplg_ext_record *)0x0) ||
         ((plVar19->record->plugin).parse == (lyplg_ext_parse_clb)0x0)) goto LAB_0015cf43;
      if (*(short *)&plVar19->parent_stmt == 0) {
        puVar2 = *(undefined8 **)(pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
        pcVar3 = (char *)puVar2[1];
        sVar10 = strlen(pcVar3);
        pcVar16 = (char *)malloc((ulong)((int)sVar10 + 3));
        if (pcVar16 == (char *)0x0) {
          if (pctx == (lysp_ctx *)0x0) goto LAB_0015ce7b;
          plVar14 = (ly_ctx *)*puVar2;
          goto LAB_0015ce7d;
        }
        iVar6 = (int)sVar10 + 2;
        local_84 = sprintf(pcVar16,"/%s:",pcVar3);
LAB_0015cdb2:
        plVar19 = local_80;
        pcVar3 = local_80->name;
        sVar10 = strlen(pcVar3);
        iVar6 = iVar6 + (int)sVar10;
        pcVar16 = (char *)realloc(pcVar16,(ulong)(iVar6 + 0xf));
        if (pcVar16 == (char *)0x0) goto LAB_0015ce52;
        iVar7 = sprintf(pcVar16 + local_84,"{extension=\'%s\'}",pcVar3);
        __s = (lysc_node *)plVar19->argument;
        bVar4 = true;
        if (__s != (lysc_node *)0x0) {
          sVar10 = strlen((char *)__s);
          pcVar16 = (char *)realloc(pcVar16,(ulong)((int)sVar10 + iVar6 + 0x10));
          if (pcVar16 == (char *)0x0) goto LAB_0015ce52;
          sprintf(pcVar16 + (iVar7 + local_84),"/%s",__s);
        }
        LVar5 = LY_SUCCESS;
        local_70 = pcVar16;
      }
      else {
        plVar20 = (lyd_meta *)plVar19->parent;
        plVar13 = (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
        local_90 = (char *)0x0;
        if (plVar20 == (lyd_meta *)0x0) {
          iVar6 = 0;
        }
        else {
          do {
            pcVar3 = local_90;
            if (plVar20->parent == (lyd_node *)0x0) {
              pcVar16 = local_90;
              if (local_90 == (char *)0x0) {
                pcVar16 = "";
              }
              iVar6 = asprintf(&local_90,"%s%s:%s%s","/",*(undefined8 *)(*(long *)plVar13 + 8),
                               plVar20->name,pcVar16);
            }
            else {
              pcVar16 = local_90;
              if (local_90 == (char *)0x0) {
                pcVar16 = "";
              }
              iVar6 = asprintf(&local_90,"%s%s%s","/",plVar20->name,pcVar16);
            }
            free(pcVar3);
            plVar20 = (lyd_meta *)plVar20->parent;
          } while ((plVar20 != (lyd_meta *)0x0) && (-1 < iVar6));
        }
        if (iVar6 < 0) {
          free(local_90);
          local_90 = (char *)0x0;
        }
        else if (iVar6 == 0) {
          local_90 = strdup("/");
        }
        pcVar3 = local_90;
        if (local_90 != (char *)0x0) {
          sVar10 = strlen(local_90);
          iVar7 = (int)sVar10;
          pcVar16 = (char *)realloc(pcVar3,(ulong)(iVar7 + 2));
          if (pcVar16 != (char *)0x0) {
            iVar6 = iVar7 + 1;
            (pcVar16 + (sVar10 & 0xffffffff))[0] = '/';
            (pcVar16 + (sVar10 & 0xffffffff))[1] = '\0';
            local_84 = iVar7 + 1;
            goto LAB_0015cdb2;
          }
        }
LAB_0015ce52:
        if (pctx == (lysp_ctx *)0x0) {
LAB_0015ce7b:
          plVar14 = (ly_ctx *)0x0;
        }
        else {
          plVar14 = (ly_ctx *)
                    **(undefined8 **)
                      (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
        }
LAB_0015ce7d:
        bVar4 = false;
        LVar5 = LY_EMEM;
        ly_log(plVar14,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lysp_resolve_ext_instance_log_path");
      }
      pvVar18 = local_68;
      pcVar3 = local_70;
      if (!bVar4) {
        return LVar5;
      }
      ly_log_location((lysc_node *)0x0,(lyd_node *)0x0,local_70,(ly_in *)0x0);
      plVar19 = local_80;
      LVar5 = (*(local_80->record->plugin).parse)(pctx,local_80);
      ly_log_location_revert(0,0,1,0);
      free(pcVar3);
      if (LVar5 != LY_ENOT) goto LAB_0015cf3f;
      lysp_ext_instance_free(&local_58,plVar19);
      pvVar11 = (void *)((long)plVar1[-1].priv - 1);
      plVar1[-1].priv = pvVar11;
      if (pvVar18 < pvVar11 && plVar1 != (lyd_node *)0x0) {
        plVar13 = plVar1 + (long)pvVar11 * 2;
        plVar15 = plVar19;
        for (lVar12 = 0xe; lVar12 != 0; lVar12 = lVar12 + -1) {
          plVar15->name = *(char **)plVar13;
          plVar13 = (lyd_node *)((long)plVar13 + (ulong)bVar21 * -0x10 + 8);
          plVar15 = (lysp_ext_instance *)((long)plVar15 + (ulong)bVar21 * -0x10 + 8);
        }
      }
    }
    local_78 = local_78 + 1;
    if ((pctx->ext_inst).count <= local_78) {
      return LY_SUCCESS;
    }
  } while( true );
LAB_0015cf3f:
  if (LVar5 != LY_SUCCESS) {
    return LVar5;
  }
LAB_0015cf43:
  pvVar18 = (void *)((long)pvVar18 + 1);
  goto LAB_0015cbed;
}

Assistant:

static LY_ERR
lysp_resolve_ext_instance_records(struct lysp_ctx *pctx)
{
    LY_ERR r;
    struct lysf_ctx fctx = {.ctx = PARSER_CTX(pctx)};
    struct lysp_ext_instance *exts, *ext;
    const struct lys_module *mod;
    uint32_t i;
    LY_ARRAY_COUNT_TYPE u;
    char *path = NULL;

    /* first finish parsing all extension instances ... */
    for (i = 0; i < pctx->ext_inst.count; ++i) {
        exts = pctx->ext_inst.objs[i];
        LY_ARRAY_FOR(exts, u) {
            ext = &exts[u];

            /* find the extension definition */
            LY_CHECK_RET(lysp_ext_find_definition(PARSER_CTX(pctx), ext, &mod, &ext->def));

            /* resolve the argument, if needed */
            LY_CHECK_RET(lysp_ext_instance_resolve_argument(PARSER_CTX(pctx), ext));

            /* find the extension record, if any */
            ext->record = lyplg_ext_record_find(mod->ctx, mod->name, mod->revision, ext->def->name);
        }
    }

    /* ... then call the parse callback */
    for (i = 0; i < pctx->ext_inst.count; ++i) {
        exts = pctx->ext_inst.objs[i];
        u = 0;
        while (u < LY_ARRAY_COUNT(exts)) {
            ext = &exts[u];
            if (!ext->record || !ext->record->plugin.parse) {
                goto next_iter;
            }

            /* set up log path */
            if ((r = lysp_resolve_ext_instance_log_path(pctx, ext, &path))) {
                return r;
            }
            ly_log_location(NULL, NULL, path, NULL);

            /* parse */
            r = ext->record->plugin.parse(pctx, ext);

            ly_log_location_revert(0, 0, 1, 0);
            free(path);

            if (r == LY_ENOT) {
                /* instance should be ignored, remove it */
                lysp_ext_instance_free(&fctx, ext);
                LY_ARRAY_DECREMENT(exts);
                if (u < LY_ARRAY_COUNT(exts)) {
                    /* replace by the last item */
                    *ext = exts[LY_ARRAY_COUNT(exts)];
                } /* else if there are no more items, leave the empty array, we are not able to free it */
                continue;
            } else if (r) {
                /* error */
                return r;
            }

next_iter:
            ++u;
        }
    }

    return LY_SUCCESS;
}